

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

UChar * u_strrchr32_63(UChar *s,UChar32 c)

{
  UChar *pUVar1;
  UChar UVar2;
  uint uVar3;
  
  if ((uint)c < 0x10000) {
    pUVar1 = u_strrchr_63(s,(UChar)c);
    return pUVar1;
  }
  if (((uint)c < 0x110000) && (UVar2 = *s, UVar2 != L'\0')) {
    pUVar1 = (UChar *)0x0;
    do {
      uVar3 = (uint)(ushort)UVar2;
      UVar2 = s[1];
      if ((c & 0x3ffU | 0xdc00) == (uint)(ushort)UVar2 && uVar3 == ((uint)c >> 10) + 0xd7c0) {
        pUVar1 = s;
      }
      s = s + 1;
    } while (UVar2 != L'\0');
    return pUVar1;
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strrchr32(const UChar *s, UChar32 c) {
    if((uint32_t)c<=U_BMP_MAX) {
        /* find BMP code point */
        return u_strrchr(s, (UChar)c);
    } else if((uint32_t)c<=UCHAR_MAX_VALUE) {
        /* find supplementary code point as surrogate pair */
        const UChar *result=NULL;
        UChar cs, lead=U16_LEAD(c), trail=U16_TRAIL(c);

        while((cs=*s++)!=0) {
            if(cs==lead && *s==trail) {
                result=s-1;
            }
        }
        return (UChar *)result;
    } else {
        /* not a Unicode code point, not findable */
        return NULL;
    }
}